

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void __thiscall
duckdb::Prefix::Prefix(Prefix *this,ART *art,Node ptr_p,bool is_mutable,bool set_in_memory)

{
  _Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
  _Var1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  type paVar7;
  pointer pFVar8;
  data_ptr_t pdVar9;
  Node *pNVar10;
  ulong uVar11;
  undefined3 in_register_00000081;
  
  paVar7 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var1.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
       paVar7->_M_elems[0].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>;
  uVar11 = (ulong)ptr_p.super_IndexPointer.data & 0xffffffff;
  plVar2 = *(long **)(*(long *)((long)_Var1.
                                      super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                      _M_head_impl + 0x38) +
                     (uVar11 % *(ulong *)((long)_Var1.
                                                super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>
                                                ._M_head_impl + 0x40)) * 8);
  plVar3 = (long *)*plVar2;
  uVar4 = plVar3[1];
  if (CONCAT31(in_register_00000081,set_in_memory) == 0) {
    while (uVar11 != uVar4) {
      uVar4 = ((long *)*plVar3)[1];
      plVar2 = plVar3;
      plVar3 = (long *)*plVar3;
    }
    pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar2 + 0x10));
    pdVar9 = FixedSizeBuffer::Get(pFVar8,is_mutable);
    this->data = pdVar9 + *(long *)((long)_Var1.
                                          super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>
                                          ._M_head_impl + 0x20) +
                          (ulong)(ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) *
                          *(long *)((long)_Var1.
                                          super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>
                                          ._M_head_impl + 0x10);
  }
  else {
    while (uVar11 != uVar4) {
      uVar4 = ((long *)*plVar3)[1];
      plVar2 = plVar3;
      plVar3 = (long *)*plVar3;
    }
    lVar5 = *plVar2;
    pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(lVar5 + 0x10));
    bVar6 = BufferHandle::IsValid(&pFVar8->buffer_handle);
    if (bVar6) {
      pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(lVar5 + 0x10));
      pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
      pdVar9 = pdVar9 + *(long *)((long)_Var1.
                                        super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                        _M_head_impl + 0x20) +
                        (ulong)(ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) *
                        *(long *)((long)_Var1.
                                        super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>.
                                        _M_head_impl + 0x10);
    }
    else {
      pdVar9 = (data_ptr_t)0x0;
    }
    this->data = pdVar9;
    if (pdVar9 == (data_ptr_t)0x0) {
      pNVar10 = (Node *)0x0;
      bVar6 = false;
      goto LAB_015c895a;
    }
  }
  pNVar10 = (Node *)(this->data + (ulong)art->prefix_count + 1);
  bVar6 = true;
LAB_015c895a:
  this->ptr = pNVar10;
  this->in_memory = bVar6;
  return;
}

Assistant:

Prefix::Prefix(const ART &art, const Node ptr_p, const bool is_mutable, const bool set_in_memory) {
	if (!set_in_memory) {
		data = Node::GetAllocator(art, PREFIX).Get(ptr_p, is_mutable);
	} else {
		data = Node::GetAllocator(art, PREFIX).GetIfLoaded(ptr_p);
		if (!data) {
			ptr = nullptr;
			in_memory = false;
			return;
		}
	}
	ptr = reinterpret_cast<Node *>(data + Count(art) + 1);
	in_memory = true;
}